

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgLinearSolvers.cpp
# Opt level: O2

void TasGrid::Utils::transpose<float>(longlong M,longlong N,float *A,float *B)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long N_00;
  long M_00;
  long lVar5;
  
  lVar4 = (N / 0x40 + 1) - (ulong)((N & 0x3fU) == 0);
  lVar5 = ((M / 0x40 + 1) - (ulong)((M & 0x3fU) == 0)) * lVar4;
  lVar3 = 0;
  if (lVar5 < 1) {
    lVar5 = lVar3;
  }
  for (; lVar5 != lVar3; lVar3 = lVar3 + 1) {
    lVar1 = lVar3 / lVar4;
    lVar2 = lVar3 % lVar4;
    M_00 = M + lVar1 * -0x40;
    if (0x3f < M_00) {
      M_00 = 0x40;
    }
    N_00 = N + lVar2 * -0x40;
    if (0x3f < N_00) {
      N_00 = 0x40;
    }
    copy_transpose<float>
              (M_00,N_00,A + lVar1 * 0x40 + lVar2 * 0x40 * M,M,B + lVar1 * 0x40 * N + lVar2 * 0x40,N
              );
  }
  return;
}

Assistant:

void transpose(long long M, long long N, scalar_type const A[], scalar_type B[]){
    constexpr long long bsize = 64;
    long long bM = (M / bsize) + ((M % bsize == 0) ? 0 : 1); // number of blocks in M and N
    long long bN = (N / bsize) + ((N % bsize == 0) ? 0 : 1);
    #pragma omp parallel for
    for(long long t =0; t < bM * bN; t++){
        long long i = t / bN;
        long long j = t % bN;
        copy_transpose(std::min(bsize, M - i * bsize), std::min(bsize, N - j * bsize),
                        A + i * bsize + j * bsize * M, M,
                        B + i * bsize * N + j * bsize, N);
    }
}